

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

void __thiscall
cppcms::json::bad_value_cast::bad_value_cast(bad_value_cast *this,string *s,json_type actual)

{
  ostream *out;
  ostringstream msg;
  string asStack_1b8 [32];
  ostringstream local_198 [376];
  
  booster::bad_cast::bad_cast(&this->super_bad_cast);
  *(undefined ***)&this->super_bad_cast = &PTR__bad_value_cast_00113bb8;
  (this->super_bad_cast).super_backtrace._vptr_backtrace =
       (_func_int **)&PTR__bad_value_cast_00113be0;
  std::operator+(&this->msg_,"cppcms::json::bad_cast: ",s);
  std::__cxx11::ostringstream::ostringstream(local_198);
  out = std::operator<<((ostream *)local_198," error converting from ");
  operator<<(out,actual);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::append((string *)&this->msg_);
  std::__cxx11::string::~string(asStack_1b8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return;
}

Assistant:

bad_value_cast::bad_value_cast(std::string const &s,json_type actual) : 
		msg_("cppcms::json::bad_cast: " + s)
	{
		std::ostringstream msg;
		msg<<" error converting from "<<actual;
		msg_ +=msg.str();

	}